

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall cppcms::widgets::select_multiple::selected_ids_abi_cxx11_(select_multiple *this)

{
  size_type sVar1;
  reference pvVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  value_type *in_RDI;
  uint i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ids;
  uint local_18;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x3fae5f);
  for (local_18 = 0;
      sVar1 = std::
              vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
              ::size((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                      *)&in_RSI[10]._M_t._M_impl.super__Rb_tree_header._M_node_count),
      local_18 < sVar1; local_18 = local_18 + 1) {
    pvVar2 = std::
             vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
             ::operator[]((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                           *)&in_RSI[10]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (ulong)local_18);
    if (((undefined1  [200])*pvVar2 & (undefined1  [200])0x1) != (undefined1  [200])0x0) {
      std::
      vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
      ::operator[]((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                    *)&in_RSI[10]._M_t._M_impl.super__Rb_tree_header._M_node_count,(ulong)local_18);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(in_RSI,in_RDI);
    }
  }
  return (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::set<std::string> select_multiple::selected_ids()
{
	std::set<std::string> ids;
	for(unsigned i=0;i<elements_.size();i++)
		if(elements_[i].selected)
			ids.insert(elements_[i].id);
	return ids;
}